

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen7Texture.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmGen7TextureCalc::Get2DMipMapHeight(GmmGen7TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  uint8_t uVar1;
  uint32_t local_80;
  uint32_t local_74;
  uint32_t local_5c;
  uint32_t AlignedHeightLines;
  GMM_PLATFORM_INFO *pPlatform;
  uint local_48;
  uint8_t Compress;
  uint32_t i;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t VAlign;
  uint32_t HeightLinesLevel2;
  uint32_t HeightLinesLevel1;
  uint32_t HeightLinesLevel0;
  uint32_t HeightLines;
  uint32_t NumLevels;
  uint32_t BlockHeight;
  uint32_t Height;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen7TextureCalc *this_local;
  
  _BlockHeight = pTexInfo;
  pTexInfo_local = (GMM_TEXTURE_INFO *)this;
  GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  NumLevels = _BlockHeight->BaseHeight;
  uVar1 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,_BlockHeight->Format);
  HeightLinesLevel0 = _BlockHeight->MaxLod;
  HeightLinesLevel1 = NumLevels;
  CompressWidth = (_BlockHeight->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,_BlockHeight->Format,&i,&CompressDepth,
             (uint32_t *)&stack0xffffffffffffffbc);
  if ((((ulong)(_BlockHeight->Flags).Gpu >> 6 & 1) == 0) &&
     (((ulong)(_BlockHeight->Flags).Gpu >> 0x1d & 1) == 0)) {
    local_74 = 1;
  }
  else {
    local_74 = (_BlockHeight->MSAA).NumSamples;
  }
  HeightLinesLevel2 =
       GmmTextureCalc::ExpandHeight
                 (&this->super_GmmTextureCalc,HeightLinesLevel1,CompressWidth,local_74);
  if (uVar1 == '\0') {
    if (((ulong)(_BlockHeight->Flags).Gpu >> 0x1d & 1) != 0) {
      HeightLinesLevel2 = HeightLinesLevel2 >> 1;
    }
  }
  else {
    HeightLinesLevel2 = HeightLinesLevel2 / CompressDepth;
  }
  HeightLines = HeightLinesLevel2;
  CompressHeight = 0;
  VAlign = 0;
  for (local_48 = 1; local_48 <= HeightLinesLevel0; local_48 = local_48 + 1) {
    HeightLinesLevel1 = HeightLinesLevel1 >> 1;
    if ((((ulong)(_BlockHeight->Flags).Gpu >> 6 & 1) == 0) &&
       (((ulong)(_BlockHeight->Flags).Gpu >> 0x1d & 1) == 0)) {
      local_80 = 1;
    }
    else {
      local_80 = (_BlockHeight->MSAA).NumSamples;
    }
    local_5c = GmmTextureCalc::ExpandHeight
                         (&this->super_GmmTextureCalc,HeightLinesLevel1,CompressWidth,local_80);
    if (uVar1 == '\0') {
      if (((ulong)(_BlockHeight->Flags).Gpu >> 0x1d & 1) != 0) {
        local_5c = local_5c >> 1;
      }
    }
    else {
      local_5c = local_5c / CompressDepth;
    }
    if (local_48 == 1) {
      VAlign = local_5c;
    }
    else {
      CompressHeight = local_5c + CompressHeight;
    }
  }
  if (VAlign < CompressHeight) {
    if (CompressWidth != 0) {
      CompressHeight =
           CompressHeight +
           ((CompressWidth - 1) - (CompressHeight + (CompressWidth - 1)) % CompressWidth);
    }
  }
  else {
    CompressHeight = VAlign;
    if (CompressWidth != 0) {
      CompressHeight =
           VAlign + ((CompressWidth - 1) - (VAlign + (CompressWidth - 1)) % CompressWidth);
    }
  }
  HeightLines = CompressHeight + HeightLines;
  return HeightLines;
}

Assistant:

uint32_t GmmLib::GmmGen7TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t Height, BlockHeight, NumLevels; // Final height for 2D surface
    uint32_t HeightLines, HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint32_t i;
    uint8_t  Compress;

    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // Mip 0 height is needed later
    Height      = pTexInfo->BaseHeight;
    Compress    = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    NumLevels   = pTexInfo->MaxLod;
    HeightLines = Height;
    VAlign      = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, HeightLines, VAlign, pTexInfo);

    if(Compress)
    {
        HeightLinesLevel0 /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil)
    {
        HeightLinesLevel0 /= 2;
    }

    // Start out with mip0
    BlockHeight = HeightLinesLevel0;

    // Height of mip1 and height of all others mips(2,3,4,5,,) needed later
    HeightLinesLevel1 = HeightLinesLevel2 = 0;
    for(i = 1; i <= NumLevels; i++)
    {
        uint32_t AlignedHeightLines;

        HeightLines >>= 1;

        AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, HeightLines, VAlign, pTexInfo);

        if(Compress)
        {
            AlignedHeightLines /= CompressHeight;
        }
        else if(pTexInfo->Flags.Gpu.SeparateStencil)
        {
            AlignedHeightLines /= 2;
        }

        if(i == 1)
        {
            HeightLinesLevel1 = AlignedHeightLines;
        }
        else
        {
            HeightLinesLevel2 += AlignedHeightLines;
        }
    }

    // If mip1 height covers all others then that is all we need
    if(HeightLinesLevel1 >= HeightLinesLevel2)
    {
        BlockHeight += GFX_ALIGN_NP2(HeightLinesLevel1, VAlign);
    }
    else
    {
        BlockHeight += GFX_ALIGN_NP2(HeightLinesLevel2, VAlign);
    }

    GMM_DPF_EXIT;
    return (BlockHeight);
}